

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSModel.cpp
# Opt level: O3

XSModelGroupDefinition * __thiscall
xercesc_4_0::XSModel::getModelGroupDefinition(XSModel *this,XMLCh *name,XMLCh *compNamespace)

{
  XSNamespaceItem *this_00;
  XSModelGroupDefinition *pXVar1;
  
  if (compNamespace == (XMLCh *)0x0) {
    compNamespace = L"";
  }
  this_00 = getNamespaceItem(this,compNamespace);
  if (this_00 != (XSNamespaceItem *)0x0) {
    pXVar1 = XSNamespaceItem::getModelGroupDefinition(this_00,name);
    return pXVar1;
  }
  return (XSModelGroupDefinition *)0x0;
}

Assistant:

XSModelGroupDefinition *XSModel::getModelGroupDefinition(const XMLCh *name
            , const XMLCh *compNamespace)
{
    XSNamespaceItem* namespaceItem;
    if (compNamespace)
        namespaceItem = getNamespaceItem(compNamespace);
    else
        namespaceItem = getNamespaceItem(XMLUni::fgZeroLenString);

    if (namespaceItem)
        return namespaceItem->getModelGroupDefinition(name);

    return 0;
}